

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexturefiledata.cpp
# Opt level: O2

void __thiscall QTextureFileData::setData(QTextureFileData *this,QImage *image,int level,int face)

{
  QTextureFileDataPrivate *pQVar1;
  pointer pQVar2;
  
  pQVar1 = QSharedDataPointer<QTextureFileDataPrivate>::operator->(&this->d);
  QTextureFileDataPrivate::ensureSize(pQVar1,level + 1,face + 1,false);
  pQVar1 = QSharedDataPointer<QTextureFileDataPrivate>::operator->(&this->d);
  pQVar2 = QList<QImage>::data((QList<QImage> *)
                               ((long)face * 0x18 +
                               (long)(pQVar1->images).super_QVLABase<QList<QImage>_>.
                                     super_QVLABaseBase.ptr));
  QImage::operator=(pQVar2 + level,image);
  return;
}

Assistant:

void QTextureFileData::setData(const QImage &image, int level, int face)
{
    Q_ASSERT(d->mode == ImageMode);
    d->ensureSize(level + 1, face + 1);
    d->images[face][level] = image;
}